

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_ToFloat64Free(JSContext *ctx,double *pres,JSValue val)

{
  double *in_RCX;
  double in_RDX;
  double *in_RSI;
  uint32_t tag;
  JSValue in_stack_00000000;
  undefined4 local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((uint)in_RCX < 3) {
    local_18 = SUB84(in_RDX,0);
    *in_RSI = (double)local_18;
    iVar1 = 0;
  }
  else if ((uint)in_RCX == 7) {
    *in_RSI = in_RDX;
    iVar1 = 0;
  }
  else {
    iVar1 = __JS_ToFloat64Free((JSContext *)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RCX,
                               in_stack_00000000);
  }
  return iVar1;
}

Assistant:

static inline int JS_ToFloat64Free(JSContext *ctx, double *pres, JSValue val)
{
    uint32_t tag;

    tag = JS_VALUE_GET_TAG(val);
    if (tag <= JS_TAG_NULL) {
        *pres = JS_VALUE_GET_INT(val);
        return 0;
    } else if (JS_TAG_IS_FLOAT64(tag)) {
        *pres = JS_VALUE_GET_FLOAT64(val);
        return 0;
    } else {
        return __JS_ToFloat64Free(ctx, pres, val);
    }
}